

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibIO.cpp
# Opt level: O3

int lib::io::Stdin(State *state)

{
  UserData *user_data;
  Table *pTVar1;
  StackAPI api;
  StackAPI SStack_28;
  
  luna::StackAPI::StackAPI(&SStack_28,state);
  user_data = luna::State::NewUserData(state);
  pTVar1 = luna::State::GetMetatable(state,"file");
  user_data->user_data_ = _stdin;
  user_data->metatable_ = pTVar1;
  luna::StackAPI::PushUserData(&SStack_28,user_data);
  return 1;
}

Assistant:

int Stdin(luna::State *state)
    {
        luna::StackAPI api(state);
        auto user_data = state->NewUserData();
        auto metatable = state->GetMetatable(METATABLE_FILE);
        user_data->Set(stdin, metatable);
        api.PushUserData(user_data);
        return 1;
    }